

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

int SUNLinSolFree_SPTFQMR(SUNLinearSolver S)

{
  N_Vector p_Var1;
  N_Vector *vs;
  
  if (S != (SUNLinearSolver)0x0) {
    p_Var1 = *(N_Vector *)((long)S->content + 0x58);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x60);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x68);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x70);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x78);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    vs = *(N_Vector **)((long)S->content + 0x80);
    if (vs != (N_Vector *)0x0) {
      N_VDestroyVectorArray(vs,2);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x88);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x90);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0x98);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    p_Var1 = *(N_Vector *)((long)S->content + 0xa0);
    if (p_Var1 != (N_Vector)0x0) {
      N_VDestroy(p_Var1);
    }
    free(S->content);
    S->content = (void *)0x0;
    free(S->ops);
    S->ops = (_generic_SUNLinearSolver_Ops *)0x0;
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPTFQMR(SUNLinearSolver S)
{
  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPTFQMR_CONTENT(S)->r_star)
    N_VDestroy(SPTFQMR_CONTENT(S)->r_star);
  if (SPTFQMR_CONTENT(S)->q)
    N_VDestroy(SPTFQMR_CONTENT(S)->q);
  if (SPTFQMR_CONTENT(S)->d)
    N_VDestroy(SPTFQMR_CONTENT(S)->d);
  if (SPTFQMR_CONTENT(S)->v)
    N_VDestroy(SPTFQMR_CONTENT(S)->v);
  if (SPTFQMR_CONTENT(S)->p)
    N_VDestroy(SPTFQMR_CONTENT(S)->p);
  if (SPTFQMR_CONTENT(S)->r)
    N_VDestroyVectorArray(SPTFQMR_CONTENT(S)->r, 2);
  if (SPTFQMR_CONTENT(S)->u)
    N_VDestroy(SPTFQMR_CONTENT(S)->u);
  if (SPTFQMR_CONTENT(S)->vtemp1)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp1);
  if (SPTFQMR_CONTENT(S)->vtemp2)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp2);
  if (SPTFQMR_CONTENT(S)->vtemp3)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp3);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}